

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O3

int Abc_NtkCheckConstant_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = (pObj->vFanins).nSize;
  while( true ) {
    if (iVar1 == 0) {
      iVar1 = -1;
      if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
        iVar2 = Abc_NodeIsConst0(pObj);
        iVar1 = 0;
        if (iVar2 == 0) {
          iVar2 = Abc_NodeIsConst1(pObj);
          iVar1 = 1;
          if (iVar2 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                          ,0x30a,"int Abc_NtkCheckConstant_rec(Abc_Obj_t *)");
          }
        }
      }
      return iVar1;
    }
    if (1 < iVar1) {
      return -1;
    }
    uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
    if (uVar3 == 8) {
      return -1;
    }
    if ((uVar3 == 7) && (iVar1 = Abc_NodeIsBuf(pObj), iVar1 == 0)) break;
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
    iVar1 = (pObj->vFanins).nSize;
  }
  iVar1 = Abc_NodeIsInv(pObj);
  if (iVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                  ,0x31a,"int Abc_NtkCheckConstant_rec(Abc_Obj_t *)");
  }
  iVar1 = Abc_NtkCheckConstant_rec((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
  if (iVar1 == 0) {
    return 1;
  }
  return -(uint)(iVar1 != 1);
}

Assistant:

int Abc_NtkCheckConstant_rec( Abc_Obj_t * pObj )
{
    if ( Abc_ObjFaninNum(pObj) == 0 )
    {
        if ( !Abc_ObjIsNode(pObj) )
            return -1;
        if ( Abc_NodeIsConst0(pObj) )
            return 0;
        if ( Abc_NodeIsConst1(pObj) )
            return 1;
        assert( 0 );
        return -1;
    }
    if ( Abc_ObjIsLatch(pObj) || Abc_ObjFaninNum(pObj) > 1 )
        return -1;
    if ( !Abc_ObjIsNode(pObj) || Abc_NodeIsBuf(pObj) )
        return Abc_NtkCheckConstant_rec( Abc_ObjFanin0(pObj) );
    if ( Abc_NodeIsInv(pObj) )
    {
        int RetValue = Abc_NtkCheckConstant_rec( Abc_ObjFanin0(pObj) );
        if ( RetValue == 0 )
            return 1;
        if ( RetValue == 1 )
            return 0;
        return RetValue;
    }
    assert( 0 );
    return -1;
}